

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

void uv__wait_children(uv_loop_t *loop)

{
  QUEUE *papvVar1;
  __pid_t _Var2;
  int *piVar3;
  bool bVar4;
  QUEUE *h;
  QUEUE *q;
  QUEUE pending;
  pid_t pid;
  int options;
  int status;
  int term_signal;
  int exit_status;
  uv_process_t *process;
  uv_loop_t *loop_local;
  
  q = (QUEUE *)&q;
  pending[0] = &q;
  h = (QUEUE *)loop->process_handles[0];
  process = (uv_process_t *)loop;
  while (h != &loop->process_handles) {
    _term_signal = h + -7;
    h = (QUEUE *)(*h)[0];
    do {
      _Var2 = waitpid(*(__pid_t *)(_term_signal[6] + 1),&pid,1);
      bVar4 = false;
      if (_Var2 == -1) {
        piVar3 = __errno_location();
        bVar4 = *piVar3 == 4;
      }
    } while (bVar4);
    if (_Var2 != 0) {
      if (_Var2 == -1) {
        piVar3 = __errno_location();
        if (*piVar3 != 10) {
          abort();
        }
      }
      else {
        if (_Var2 != *(int *)(_term_signal[6] + 1)) {
          __assert_fail("pid == process->pid",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/process.c"
                        ,0x81,"void uv__wait_children(uv_loop_t *)");
        }
        *(pid_t *)_term_signal[8] = pid;
        *(void **)_term_signal[7][1] = _term_signal[7][0];
        *(void **)((long)_term_signal[7][0] + 8) = _term_signal[7][1];
        _term_signal[7][0] = &q;
        _term_signal[7][1] = pending[0];
        *(QUEUE **)_term_signal[7][1] = _term_signal + 7;
        pending[0] = _term_signal + 7;
      }
    }
  }
  papvVar1 = q;
  while (h = papvVar1, h != (QUEUE *)&q) {
    _term_signal = h + -7;
    papvVar1 = (QUEUE *)(*h)[0];
    *(void **)(*h)[1] = (*h)[0];
    *(void **)((long)(*h)[0] + 8) = (*h)[1];
    (*h)[0] = h;
    (*h)[1] = h;
    if ((((ulong)h[-2][1] & 4) != 0) &&
       (*(uint *)(h[-2] + 1) = *(uint *)(h[-2] + 1) & 0xfffffffb, ((ulong)h[-2][1] & 8) != 0)) {
      *(int *)((long)h[-7][1] + 8) = *(int *)((long)h[-7][1] + 8) + -1;
    }
    if (h[-1][0] != (void *)0x0) {
      status = 0;
      if (((ulong)h[1][0] & 0x7f) == 0) {
        status = (int)(*(uint *)h[1] & 0xff00) >> 8;
      }
      options = 0;
      if ('\0' < (char)(((byte)*(undefined4 *)h[1] & 0x7f) + 1) >> 1) {
        options = *(uint *)h[1] & 0x7f;
      }
      (*(code *)h[-1][0])(_term_signal,status,options);
    }
  }
  if ((QUEUE *)&q != q) {
    __assert_fail("QUEUE_EMPTY(&pending)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/process.c"
                  ,0x9e,"void uv__wait_children(uv_loop_t *)");
  }
  return;
}

Assistant:

void uv__wait_children(uv_loop_t* loop) {
  uv_process_t* process;
  int exit_status;
  int term_signal;
  int status;
  int options;
  pid_t pid;
  QUEUE pending;
  QUEUE* q;
  QUEUE* h;

  QUEUE_INIT(&pending);

  h = &loop->process_handles;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

#ifndef UV_USE_SIGCHLD
    if ((process->flags & UV_HANDLE_REAP) == 0)
      continue;
    options = 0;
    process->flags &= ~UV_HANDLE_REAP;
#else
    options = WNOHANG;
#endif

    do
      pid = waitpid(process->pid, &status, options);
    while (pid == -1 && errno == EINTR);

#ifdef UV_USE_SIGCHLD
    if (pid == 0) /* Not yet exited */
      continue;
#endif

    if (pid == -1) {
      if (errno != ECHILD)
        abort();
      /* The child died, and we missed it. This probably means someone else
       * stole the waitpid from us. Handle this by not handling it at all. */
      continue;
    }

    assert(pid == process->pid);
    process->status = status;
    QUEUE_REMOVE(&process->queue);
    QUEUE_INSERT_TAIL(&pending, &process->queue);
  }

  h = &pending;
  q = QUEUE_HEAD(h);
  while (q != h) {
    process = QUEUE_DATA(q, uv_process_t, queue);
    q = QUEUE_NEXT(q);

    QUEUE_REMOVE(&process->queue);
    QUEUE_INIT(&process->queue);
    uv__handle_stop(process);

    if (process->exit_cb == NULL)
      continue;

    exit_status = 0;
    if (WIFEXITED(process->status))
      exit_status = WEXITSTATUS(process->status);

    term_signal = 0;
    if (WIFSIGNALED(process->status))
      term_signal = WTERMSIG(process->status);

    process->exit_cb(process, exit_status, term_signal);
  }
  assert(QUEUE_EMPTY(&pending));
}